

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_embedded_struct_array_field
               (flatcc_json_printer_t *ctx,int index,void *p,size_t offset,char *name,size_t len,
               size_t size,size_t count,flatcc_json_printer_struct_f *pf)

{
  char *pcVar1;
  void *pvVar2;
  size_t sVar3;
  
  if (index != 0) {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = ',';
  }
  print_name(ctx,name,len);
  ctx->level = ctx->level + 1;
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '[';
  pvVar2 = (void *)((long)p + offset);
  for (sVar3 = 0; count != sVar3; sVar3 = sVar3 + 1) {
    if (sVar3 != 0) {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = ',';
    }
    ctx->level = ctx->level + 1;
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '{';
    (*pf)(ctx,pvVar2);
    if (ctx->indent != '\0') {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '\n';
      ctx->level = ctx->level + -1;
      print_indent(ctx);
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '}';
    pvVar2 = (void *)((long)pvVar2 + size);
  }
  if (ctx->indent != '\0') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '\n';
    ctx->level = ctx->level + -1;
    print_indent(ctx);
  }
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = ']';
  return;
}

Assistant:

void flatcc_json_printer_embedded_struct_array_field(flatcc_json_printer_t *ctx,
        int index, const void *p, size_t offset,
        const char *name, size_t len,
        size_t size, size_t count,
        flatcc_json_printer_struct_f pf)
{
    size_t i;
    if (index) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_start('[');
    for (i = 0; i < count; ++i) {
        if (i > 0) {
            print_char(',');
        }
        print_start('{');                                                   \
        pf(ctx, (uint8_t *)p + offset + i * size);
        print_end('}');
    }
    print_end(']');
}